

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void icetSingleImageCompose
               (IceTInt *compose_group,IceTInt group_size,IceTInt image_dest,
               IceTSparseImage input_image,IceTSparseImage *result_image,IceTSizeType *piece_offset)

{
  IceTEnum local_34;
  IceTSizeType *pIStack_30;
  IceTEnum strategy;
  IceTSizeType *piece_offset_local;
  IceTSparseImage *result_image_local;
  IceTInt image_dest_local;
  IceTInt group_size_local;
  IceTInt *compose_group_local;
  IceTSparseImage input_image_local;
  
  pIStack_30 = piece_offset;
  piece_offset_local = (IceTSizeType *)result_image;
  result_image_local._0_4_ = image_dest;
  result_image_local._4_4_ = group_size;
  _image_dest_local = compose_group;
  compose_group_local = (IceTInt *)input_image.opaque_internals;
  icetGetEnumv(0x25,&local_34);
  icetInvokeSingleImageStrategy
            (local_34,_image_dest_local,result_image_local._4_4_,(IceTInt)result_image_local,
             (IceTSparseImage)compose_group_local,(IceTSparseImage *)piece_offset_local,pIStack_30);
  return;
}

Assistant:

void icetSingleImageCompose(IceTInt *compose_group,
                            IceTInt group_size,
                            IceTInt image_dest,
                            IceTSparseImage input_image,
                            IceTSparseImage *result_image,
                            IceTSizeType *piece_offset)
{
    IceTEnum strategy;

    icetGetEnumv(ICET_SINGLE_IMAGE_STRATEGY, &strategy);
    icetInvokeSingleImageStrategy(strategy,
                                  compose_group,
                                  group_size,
                                  image_dest,
                                  input_image,
                                  result_image,
                                  piece_offset);
}